

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS JlOutputJsonEx(JlDataObject *DataObject,JL_OUTPUT_FLAGS OutputFlags,
                        char **pJsonStringBuffer)

{
  JL_DATA_TYPE JVar1;
  ProcessStack *Stack;
  size_t __n;
  void *__src;
  char *__dest;
  char *string;
  char *dataBuffer;
  size_t stringLen;
  ProcessStack *stack;
  JlBuffer *flexiBuffer;
  char **ppcStack_20;
  JL_STATUS jlStatus;
  char **pJsonStringBuffer_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlDataObject *DataObject_local;
  
  if ((DataObject == (JlDataObject *)0x0) || (pJsonStringBuffer == (char **)0x0)) {
    flexiBuffer._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pJsonStringBuffer = (char *)0x0;
    ppcStack_20 = pJsonStringBuffer;
    pJsonStringBuffer_local = (char **)OutputFlags;
    OutputFlags_local = (JL_OUTPUT_FLAGS)DataObject;
    stack = (ProcessStack *)JlBufferCreate();
    if (stack == (ProcessStack *)0x0) {
      flexiBuffer._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      Stack = (ProcessStack *)WjTestLib_Calloc(0x600,1);
      if (Stack == (ProcessStack *)0x0) {
        flexiBuffer._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        memset(Stack + 1,0,0x18);
        Stack[1].Object = (JlDataObject *)OutputFlags_local;
        JVar1 = JlGetObjectType((JlDataObject *)OutputFlags_local);
        Stack[1].ObjectType = JVar1;
        flexiBuffer._4_4_ =
             ProcessTheStack(Stack,(JlBuffer *)stack,(JL_OUTPUT_FLAGS)pJsonStringBuffer_local);
        if (flexiBuffer._4_4_ == JL_STATUS_SUCCESS) {
          if (((ulong)pJsonStringBuffer_local & 2) != 0) {
            JlBufferAdd((JlBuffer *)stack,"\n",1);
          }
          __n = JlBufferGetDataSize((JlBuffer *)stack);
          __src = JlBufferGetDataBuffer((JlBuffer *)stack);
          __dest = (char *)WjTestLib_Calloc(__n + 1,1);
          if (__dest == (char *)0x0) {
            flexiBuffer._4_4_ = JL_STATUS_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,__src,__n);
            __dest[__n] = '\0';
            *ppcStack_20 = __dest;
          }
        }
        WjTestLib_Free(Stack);
      }
      JlBufferFree((JlBuffer **)&stack);
    }
  }
  return flexiBuffer._4_4_;
}

Assistant:

JL_STATUS
    JlOutputJsonEx
    (
        JlDataObject const*     DataObject,
        JL_OUTPUT_FLAGS         OutputFlags,
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DataObject
        &&  NULL != pJsonStringBuffer )
    {
        *pJsonStringBuffer = NULL;

        JlBuffer* flexiBuffer = JlBufferCreate( );
        if( NULL != flexiBuffer )
        {
            ProcessStack* stack = JlAlloc( sizeof(ProcessStack) * MAX_JSON_DEPTH );
            if( NULL != stack )
            {
                // Place object on stack in position 1. Note we do not use stack[0] to store anything as we
                // are using position 0 to indicate stack is empty
                memset( &stack[1], 0, sizeof(stack[1]) );
                stack[1].Object = DataObject;
                stack[1].ObjectType = JlGetObjectType( DataObject );

                jlStatus = ProcessTheStack( stack, flexiBuffer, OutputFlags );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    if( JL_OUTPUT_FLAGS_INDENT & OutputFlags )
                    {
                        // If indented formatting is on then always end last line with a newline char
                        JlBufferAdd( flexiBuffer, "\n", 1 );
                    }

                    // Copy out the string in the flexibuffer into a newly allocated string.
                    size_t stringLen = JlBufferGetDataSize( flexiBuffer );
                    char const* dataBuffer =  JlBufferGetDataBuffer( flexiBuffer );
                    char* string = JlAlloc( stringLen + 1 );
                    if( NULL != string )
                    {
                        // Copy out string
                        memcpy( string, dataBuffer, stringLen );
                        string[stringLen] = 0;
                        *pJsonStringBuffer = string;
                    }
                    else
                    {
                        jlStatus = JL_STATUS_OUT_OF_MEMORY;
                    }
                }

                JlFree( stack );
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }

            JlBufferFree( &flexiBuffer );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}